

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O0

bool __thiscall
OpenMesh::PolyConnectivity::is_simply_connected(PolyConnectivity *this,FaceHandle _fh)

{
  bool bVar1;
  BaseHandle local_94;
  _Self local_90;
  BaseHandle local_84;
  _Self local_80 [3];
  BaseHandle local_64;
  undefined1 local_60 [8];
  ConstFaceFaceIter cff_it;
  set<OpenMesh::FaceHandle,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
  nb_fhs;
  PolyConnectivity *this_local;
  FaceHandle _fh_local;
  
  std::
  set<OpenMesh::FaceHandle,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
  ::set((set<OpenMesh::FaceHandle,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
         *)&cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_);
  local_64 = _fh.super_BaseHandle.idx_;
  cff_iter((ConstFaceFaceIter *)local_60,this,_fh);
  do {
    bVar1 = Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
            ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                        *)local_60);
    if (!bVar1) {
      this_local._7_1_ = true;
LAB_0034d773:
      std::
      set<OpenMesh::FaceHandle,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
      ::~set((set<OpenMesh::FaceHandle,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
              *)&cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_);
      return this_local._7_1_;
    }
    local_84.idx_ =
         (int)Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
              ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                           *)local_60);
    local_80[0]._M_node =
         (_Base_ptr)
         std::
         set<OpenMesh::FaceHandle,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
         ::find((set<OpenMesh::FaceHandle,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
                 *)&cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_,
                (key_type *)&local_84);
    local_90._M_node =
         (_Base_ptr)
         std::
         set<OpenMesh::FaceHandle,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
         ::end((set<OpenMesh::FaceHandle,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
                *)&cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_);
    bVar1 = std::operator==(local_80,&local_90);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_0034d773;
    }
    local_94.idx_ =
         (int)Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
              ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                           *)local_60);
    std::
    set<OpenMesh::FaceHandle,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
    ::insert((set<OpenMesh::FaceHandle,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
              *)&cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_,
             (value_type *)&local_94);
    Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
    ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                  *)local_60);
  } while( true );
}

Assistant:

bool PolyConnectivity::is_simply_connected(FaceHandle _fh) const
{
  std::set<FaceHandle> nb_fhs;
  for (ConstFaceFaceIter cff_it = cff_iter(_fh); cff_it.is_valid(); ++cff_it)
  {
    if (nb_fhs.find(*cff_it) == nb_fhs.end())
    {
      nb_fhs.insert(*cff_it);
    }
    else
    {//there is more than one link
      return false;
    }
  }
  return true;
}